

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<std::complex<long_double>_>::Print
          (TPZMatrix<std::complex<long_double>_> *this,char *name,ostream *out,
          MatrixOutputFormat form)

{
  undefined1 val_00 [16];
  undefined1 val_01 [16];
  int iVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  int64_t col_2;
  ulong uVar5;
  long lVar6;
  long lVar7;
  complex<long_double> *__z;
  char *pcVar8;
  int64_t col;
  int64_t col_3;
  long lVar9;
  long lVar10;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar11;
  undefined6 in_stack_fffffffffffffe32;
  char *local_1a8;
  complex<long_double> val;
  anon_class_4_1_2f8713ba PrintVal;
  undefined8 local_158 [4];
  ios cout_state;
  
  std::ios::ios((ios *)&cout_state,(streambuf *)0x0);
  std::ios::copyfmt(&cout_state);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 0x15;
  if (EFixedColumn < form) goto LAB_00cf650d;
  lVar2 = (this->super_TPZBaseMatrix).fRow;
  lVar4 = (this->super_TPZBaseMatrix).fCol;
  switch(form) {
  case EFormatted:
    std::operator<<(out,"Writing matrix \'");
    if (name != (char *)0x0) {
      std::operator<<(out,name);
    }
    poVar3 = std::operator<<(out,"\' (");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," x ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,"):\n");
    lVar9 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar9;
    }
    if (lVar2 < 1) {
      lVar2 = lVar9;
    }
    local_1a8 = "\n";
    for (; lVar9 != lVar2; lVar9 = lVar9 + 1) {
      std::operator<<(out,"\t");
      for (lVar7 = 0; lVar4 != lVar7; lVar7 = lVar7 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  ((complex *)&val,this,lVar9,lVar7);
        poVar3 = std::operator<<(out,(complex *)&val);
        std::operator<<(poVar3,"  ");
      }
      std::operator<<(out,"\n");
    }
    goto LAB_00cf616d;
  case EInputFormat:
    poVar3 = std::ostream::_M_insert<long>((long)out);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    lVar9 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar9;
    }
    if (lVar2 < 1) {
      lVar2 = lVar9;
    }
    local_1a8 = "-1 -1 0.\n";
    for (; lVar9 != lVar2; lVar9 = lVar9 + 1) {
      for (lVar7 = 0; lVar4 != lVar7; lVar7 = lVar7 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  ((complex *)&val,this,lVar9,lVar7);
        if ((longdouble)CONCAT28(val._M_value._8_2_,val._M_value._0_8_) == (longdouble)0) {
          if (((longdouble)CONCAT28(val._M_value._24_2_,val._M_value._16_8_) != (longdouble)0) ||
             (NAN((longdouble)CONCAT28(val._M_value._24_2_,val._M_value._16_8_)) ||
              NAN((longdouble)0))) goto LAB_00cf6104;
        }
        else {
LAB_00cf6104:
          poVar3 = std::ostream::_M_insert<long>((long)out);
          poVar3 = std::operator<<(poVar3,' ');
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          poVar3 = std::operator<<(poVar3,' ');
          poVar3 = std::operator<<(poVar3,(complex *)&val);
          std::endl<char,std::char_traits<char>>(poVar3);
        }
      }
    }
    goto LAB_00cf616d;
  case EMathematicaInput:
    poVar3 = std::operator<<(out,name);
    std::operator<<(poVar3,"\n{ ");
    lVar7 = 0;
    lVar9 = lVar4;
    if (lVar4 < 1) {
      lVar9 = lVar7;
    }
    lVar10 = lVar2;
    if (lVar2 < 1) {
      lVar10 = lVar7;
    }
    for (; lVar7 != lVar10; lVar7 = lVar7 + 1) {
      std::operator<<(out,"\n{ ");
      uVar5 = 1;
      for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&val,this,lVar7,lVar6);
        poVar3 = std::ostream::_M_insert<long_double>
                           ((longdouble)CONCAT28(val._M_value._8_2_,val._M_value._0_8_));
        std::operator<<(poVar3,"+I");
        std::ostream::_M_insert<long_double>
                  ((longdouble)CONCAT28(val._M_value._24_2_,val._M_value._16_8_));
        if (lVar6 < lVar4 + -1) {
          std::operator<<(out,", ");
        }
        if ((uVar5 / 6) * 6 + -1 == lVar6) {
          std::operator<<(out,'\n');
        }
        uVar5 = uVar5 + 1;
      }
      std::operator<<(out," }");
      if (lVar7 < lVar2 + -1) {
        std::operator<<(out,",");
      }
    }
    poVar3 = std::operator<<(out," };");
    std::endl<char,std::char_traits<char>>(poVar3);
    break;
  case EMatlabNonZeros:
    std::operator<<(out,name);
    lVar9 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar9;
    }
    if (lVar2 < 1) {
      lVar2 = lVar9;
    }
    local_1a8 = "\n";
    for (; lVar9 != lVar2; lVar9 = lVar9 + 1) {
      std::operator<<(out,"\n|");
      for (lVar7 = 0; lVar4 != lVar7; lVar7 = lVar7 + 1) {
        __z = (complex<long_double> *)this;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (local_158,this,lVar9,lVar7);
        val._M_value._16_8_ = local_158[2];
        val._M_value._24_2_ = SUB82(local_158[3],0);
        val._M_value._26_6_ = SUB86((ulong)local_158[3] >> 0x10,0);
        val._M_value._0_8_ = local_158[0];
        val._M_value._8_2_ = SUB82(local_158[1],0);
        val._M_value._10_6_ = SUB86((ulong)local_158[1] >> 0x10,0);
        std::abs<long_double>((longdouble *)&val,__z);
        pcVar8 = ".";
        if ((longdouble)1e-16 <= ABS(in_ST0)) {
          pcVar8 = "#";
        }
        lVar11 = in_ST6;
        std::operator<<(out,pcVar8);
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = lVar11;
      }
      std::operator<<(out,"|");
    }
LAB_00cf616d:
    std::operator<<(out,local_1a8);
    break;
  case EMatrixMarket:
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])(this);
    lVar4 = 0;
    if (0 < lVar2) {
      lVar4 = lVar2;
    }
    lVar9 = 0;
    while (lVar7 = lVar9, lVar7 != lVar4) {
      lVar10 = lVar7 + 1;
      if (iVar1 == 0) {
        lVar10 = lVar2;
      }
      if (lVar10 < 1) {
        lVar10 = 0;
      }
      for (lVar6 = 0; lVar9 = lVar7 + 1, lVar10 != lVar6; lVar6 = lVar6 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&val,this,lVar7,lVar6);
      }
    }
    poVar3 = std::operator<<(out,"%%");
    poVar3 = std::operator<<(poVar3,name);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<long>((long)out);
    poVar3 = std::operator<<(poVar3,' ');
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3,' ');
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    lVar9 = 0;
    while (lVar7 = lVar9, lVar7 != lVar4) {
      lVar10 = lVar7 + 1;
      if (iVar1 == 0) {
        lVar10 = lVar2;
      }
      if (lVar10 < 1) {
        lVar10 = 0;
      }
      lVar6 = 0;
      while (lVar9 = lVar7 + 1, lVar6 != lVar10) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  ((complex *)&val,this,lVar7,lVar6);
        lVar11 = (longdouble)0;
        if ((((longdouble)CONCAT28(val._M_value._8_2_,val._M_value._0_8_) != lVar11) ||
            ((longdouble)CONCAT28(val._M_value._24_2_,val._M_value._16_8_) != lVar11)) ||
           (NAN((longdouble)CONCAT28(val._M_value._24_2_,val._M_value._16_8_)) || NAN(lVar11))) {
          poVar3 = std::ostream::_M_insert<long>((long)out);
          poVar3 = std::operator<<(poVar3,' ');
          lVar6 = lVar6 + 1;
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          poVar3 = std::operator<<(poVar3,' ');
          poVar3 = std::operator<<(poVar3,(complex *)&val);
          std::operator<<(poVar3,'\n');
        }
        else {
          lVar6 = lVar6 + 1;
        }
      }
    }
    break;
  case ECSV:
    lVar7 = 0;
    lVar9 = lVar4;
    if (lVar4 < 1) {
      lVar9 = lVar7;
    }
    lVar10 = lVar2;
    if (lVar2 < 1) {
      lVar10 = lVar7;
    }
    for (; lVar7 != lVar10; lVar7 = lVar7 + 1) {
      for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&val,this,lVar7,lVar6);
        lVar11 = (longdouble)CONCAT28(val._M_value._24_2_,val._M_value._16_8_);
        poVar3 = std::ostream::_M_insert<long_double>
                           ((longdouble)CONCAT28(val._M_value._8_2_,val._M_value._0_8_));
        std::operator<<(poVar3,(lVar11 <= (longdouble)0) * '\x02' + '+');
        poVar3 = std::ostream::_M_insert<long_double>
                           (ABS((longdouble)CONCAT28(val._M_value._24_2_,val._M_value._16_8_)));
        std::operator<<(poVar3,"j");
        if (lVar6 < lVar4 + -1) {
          std::operator<<(out," , ");
        }
      }
      if (lVar7 < lVar2 + -1) {
        std::operator<<(out,"\n");
      }
    }
    break;
  case EFixedColumn:
    std::operator<<(out,"Writing matrix \'");
    if (name != (char *)0x0) {
      std::operator<<(out,name);
    }
    poVar3 = std::operator<<(out,"\' (");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," x ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,"):\n");
    PrintVal.columnlength = 0x15;
    lVar9 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar9;
    }
    if (lVar2 < 1) {
      lVar2 = lVar9;
    }
    for (; lVar9 != lVar2; lVar9 = lVar9 + 1) {
      for (lVar7 = 0; lVar4 != lVar7; lVar7 = lVar7 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                  (&val,this,lVar9,lVar7);
        val_00._8_2_ = val._M_value._8_2_;
        val_00._0_8_ = val._M_value._0_8_;
        val_01._8_2_ = val._M_value._24_2_;
        val_01._0_8_ = val._M_value._16_8_;
        std::operator<<(out,"(");
        val_00._10_6_ = in_stack_fffffffffffffe32;
        Print::anon_class_4_1_2f8713ba::operator()(&PrintVal,out,(type_conflict2)val_00);
        std::operator<<(out,",");
        val_01._10_6_ = in_stack_fffffffffffffe32;
        Print::anon_class_4_1_2f8713ba::operator()(&PrintVal,out,(type_conflict2)val_01);
        std::operator<<(out,")");
      }
      std::operator<<(out,"\n");
    }
    std::operator<<(out,"\n");
  }
LAB_00cf650d:
  std::ios::copyfmt((ios *)(out + *(long *)(*(long *)out + -0x18)));
  std::ios_base::~ios_base((ios_base *)&cout_state);
  return;
}

Assistant:

void TPZMatrix<TVar>::Print(const char *name, std::ostream& out,const MatrixOutputFormat form) const {
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value) {
        out << name << std::endl;
        for (int64_t i = 0; i < fRow; i++) {
            for (int64_t j = 0; j < fCol; j++) {
                out << "i = " << i << " j = " << j << " val " << Get(i, j) << std::endl;
            }
        }
        return;
   
    }
    //getting current settings of std::ostream instance
    std::ios cout_state(nullptr);
    cout_state.copyfmt(out);

    typedef std::numeric_limits< RTVar > typlim;
    out << std::setprecision(typlim::max_digits10);

    const auto nrows = Rows();
    const auto ncols = Cols();
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
		
        for ( int64_t row = 0; row < nrows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < ncols; col++ ) {
                out << GetVal( row, col) << "  ";//complex numbers are (a,b)
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EFixedColumn) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
        TVar value;
        constexpr int columnlength = typlim::max_digits10;

        auto PrintVal = [columnlength](std::ostream &out, RTVar val){
            if(val<0.) {
                out << std::setw(columnlength+1) << std::left << val << " ";
            }else{
                out << " ";
                out << std::setw(columnlength)   << std::left << val << " ";
            }
        };
        
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                value = Get( row, col);
                if constexpr (std::is_same_v<RTVar,TVar>){
                    PrintVal(out,value);
                }else{
                    out<<"(";
                    PrintVal(out,value.real());
                    out<<",";
                    PrintVal(out,value.imag());
                    out<<")";
                }
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << nrows << " " << ncols << endl;
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                const TVar val = GetVal(row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
        {
            
            out << name << "\n{ ";
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n{ ";
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        out << val.real() << "+I"<<val.imag();
                    }
                    if(col < ncols-1)
                        out << ", ";
                    if((col+1) % 6 == 0) out << '\n';
                }
                out << " }";
                if(row < nrows-1)
                    out << ",";
            }
		
            out << " };"<<std::endl;
		
        }else if( form == ECSV)
        {
         
            for ( int64_t row = 0; row < nrows; row++) {
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        const auto signchar = val.imag() > 0 ? '+' : '-';
                        out << val.real() <<signchar<<std::fabs(val.imag())<<"j";
                    }
                    if(col < ncols-1)  out << " , ";
                }
                if(row < nrows-1)
                    out << "\n";
            }

        } else if( form == EMatlabNonZeros)
        {
            out << name;
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n|";
                for ( int64_t col = 0; col < ncols; col++ )
                    if(IsZero(GetVal(row, col)) ){
                        out << ".";
                    }else{
                        out << "#";
                    }
                out << "|";
            }
            out << "\n";
        }
    else if( form == EMatrixMarket)
        {
            bool sym = IsSymmetric();
            int64_t numzero = 0;
            int64_t nrow = nrows;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            numzero++;
                        }
                    }
            }
            out << "%%"<< name << std::endl;
            out << nrows << ' ' << ncols << ' ' << numzero << std::endl;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        const TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            out << row+1 << ' ' << col+1 << ' ' << val << '\n';
                        }
                    }
            }
        }
    //restore precision
    out.copyfmt(cout_state);
}